

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

bool __thiscall MeCab::anon_unknown_0::ModelImpl::swap(ModelImpl *this,Model *model)

{
  undefined1 uVar1;
  Model *in_RSI;
  scoped_ptr<MeCab::Model> model_data;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  scoped_ptr<MeCab::Model> local_28 [2];
  byte local_1;
  
  scoped_ptr<MeCab::Model>::scoped_ptr(local_28,in_RSI);
  uVar1 = is_available((ModelImpl *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
  if ((bool)uVar1) {
    setGlobalError((char *)0x1a2702);
  }
  else {
    setGlobalError((char *)0x1a26cb);
  }
  local_1 = 0;
  scoped_ptr<MeCab::Model>::~scoped_ptr
            ((scoped_ptr<MeCab::Model> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0));
  return (bool)(local_1 & 1);
}

Assistant:

bool ModelImpl::swap(Model *model) {
  scoped_ptr<Model> model_data(model);

  if (!is_available()) {
    setGlobalError("current model is not available");
    return false;
  }
#ifndef HAVE_ATOMIC_OPS
  setGlobalError("atomic model replacement is not supported");
  return false;
#else
  ModelImpl *m = static_cast<ModelImpl *>(model_data.get());
  if (!m) {
    setGlobalError("Invalid model is passed");
    return false;
  }

  if (!m->is_available()) {
    setGlobalError("Passed model is not available");
    return false;
  }

  Viterbi *current_viterbi = viterbi_;
  {
    scoped_writer_lock l(mutex());
    viterbi_      = m->take_viterbi();
    request_type_ = m->request_type();
    theta_        = m->theta();
  }

  delete current_viterbi;

  return true;
#endif
}